

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O1

bool cmQTWrapCPPCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pcVar1;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var2;
  ulong uVar3;
  bool bVar4;
  string *__x;
  string *psVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmSourceFile *this_01;
  cmValue value;
  undefined8 uVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value_00;
  __single_object cc;
  string hname;
  string sourceListValue;
  string newName;
  string srcName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_1c0;
  string local_1b8;
  _Any_data local_198;
  code *local_188;
  char *pcStack_180;
  size_type local_178;
  pointer local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_158;
  code **local_150;
  size_t local_148;
  code *local_140 [2];
  string local_130;
  ulong local_110;
  string local_108;
  string local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string *local_90;
  string *local_88;
  string *local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_110 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  local_198._M_unused._M_object = &local_188;
  if (local_110 < 0x41) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_198,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_140[0] = local_188;
    uVar7 = local_198._M_unused._0_8_;
    if ((code **)local_198._M_unused._0_8_ == &local_188) goto LAB_00347fef;
  }
  else {
    this = status->Makefile;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"QT_MOC_EXECUTABLE","");
    __x = cmMakefile::GetRequiredDefinition(this,(string *)&local_198);
    if ((code **)local_198._M_unused._0_8_ != &local_188) {
      operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
    }
    local_90 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1;
    psVar5 = cmMakefile::GetSafeDefinition(this,local_90);
    local_150 = local_140;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + psVar5->_M_string_length);
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2;
    if (psVar5 != local_80) {
      do {
        this_00 = cmMakefile::GetSource(this,psVar5,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
          bVar4 = false;
        }
        else {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"WRAP_EXCLUDE","");
          bVar4 = cmSourceFile::GetPropertyAsBool(this_00,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar4 == false) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_e8,psVar5);
          psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          local_198._8_8_ = (psVar6->_M_dataplus)._M_p;
          local_198._M_unused._0_8_ = (undefined8)psVar6->_M_string_length;
          local_188 = (code *)0x5;
          pcStack_180 = "/moc_";
          local_178 = local_e8._M_string_length;
          local_170 = local_e8._M_dataplus._M_p;
          local_168 = 4;
          local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x728ea5;
          views._M_len = 4;
          views._M_array = (iterator)&local_198;
          cmCatViews_abi_cxx11_(&local_130,views);
          this_01 = cmMakefile::GetOrCreateSource(this,&local_130,true,Ambiguous);
          if (this_00 != (cmSourceFile *)0x0) {
            local_198._M_unused._M_object = &local_188;
            local_88 = psVar5;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"ABSTRACT","");
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"ABSTRACT","");
            value = cmSourceFile::GetProperty(this_00,&local_1b8);
            psVar5 = local_88;
            cmSourceFile::SetProperty(this_01,(string *)&local_198,value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
            }
            if ((code **)local_198._M_unused._0_8_ != &local_188) {
              operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
            }
          }
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          local_1b8._M_string_length = 0;
          local_1b8.field_2._M_local_buf[0] = '\0';
          bVar4 = cmsys::SystemTools::FileIsFullPath(psVar5);
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&local_1b8);
          }
          else {
            if ((this_00 == (cmSourceFile *)0x0) ||
               (bVar4 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal), !bVar4)) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
            }
            else {
              cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            }
            std::__cxx11::string::_M_assign((string *)&local_1b8);
            std::__cxx11::string::append((char *)&local_1b8);
            std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)(psVar5->_M_dataplus)._M_p);
          }
          if (local_148 != 0) {
            std::__cxx11::string::append((char *)&local_150);
          }
          std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130._M_dataplus._M_p);
          local_198._8_8_ = (__x->_M_dataplus)._M_p;
          local_198._M_unused._0_8_ = (undefined8)__x->_M_string_length;
          local_188 = (code *)0x2;
          pcStack_180 = "-o";
          local_178 = local_130._M_string_length;
          local_170 = local_130._M_dataplus._M_p;
          local_168 = local_1b8._M_string_length;
          local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p;
          ilist._M_len = 4;
          ilist._M_array = (iterator)&local_198;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_1b8);
          std::make_unique<cmCustomCommand>();
          _Var2._M_head_impl = local_1c0._M_head_impl;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_130._M_dataplus._M_p,
                     local_130._M_dataplus._M_p + local_130._M_string_length);
          cmCustomCommand::SetOutputs(_Var2._M_head_impl,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          _Var2._M_head_impl = local_1c0._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_a8);
          cmCustomCommand::SetDepends(_Var2._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var2._M_head_impl = local_1c0._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var2._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          cmCustomCommand::SetComment(local_1c0._M_head_impl,"Qt Wrapped File");
          local_158._M_head_impl = local_1c0._M_head_impl;
          local_1c0._M_head_impl = (cmCustomCommand *)0x0;
          local_188 = (code *)0x0;
          pcStack_180 = (char *)0x0;
          local_198._M_unused._M_object = (code **)0x0;
          local_198._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_158,(CommandSourceCallback *)&local_198,false);
          if (local_188 != (code *)0x0) {
            (*local_188)(&local_198,&local_198,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_158);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != local_80);
    }
    value_00._M_str = (char *)local_150;
    value_00._M_len = local_148;
    cmMakefile::AddDefinition(this,local_90,value_00);
    uVar7 = local_150;
    if (local_150 == local_140) goto LAB_00347fef;
  }
  uVar3 = local_110;
  operator_delete((void *)uVar7,(ulong)(local_140[0] + 1));
  local_110 = uVar3;
LAB_00347fef:
  return 0x40 < local_110;
}

Assistant:

bool cmQTWrapCPPCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the moc executable to run in the custom command.
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(2)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string newName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");
      cmSourceFile* sf = mf.GetOrCreateSource(newName, true);
      if (curr) {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
      }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if (cmSystemTools::FileIsFullPath(arg)) {
        hname = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          hname = mf.GetCurrentBinaryDirectory();
        } else {
          hname = mf.GetCurrentSourceDirectory();
        }
        hname += "/";
        hname += arg;
      }

      // Append the generated source file to the list.
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLines commandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", newName, hname });

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(newName);
      cc->SetDepends(depends);
      cc->SetCommandLines(commandLines);
      cc->SetComment("Qt Wrapped File");
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files.
  mf.AddDefinition(sourceList, sourceListValue);
  return true;
}